

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreTypeOperations.cpp
# Opt level: O0

pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* helics::core::extractCoreType(string *configureString)

{
  string_view configString;
  bool bVar1;
  ConfigType CVar2;
  App *this;
  pointer phVar3;
  element_type *peVar4;
  string *in_RSI;
  pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  exception *anon_var_0;
  istringstream tstring;
  shared_ptr<helics::HelicsConfigJSON> dptr_1;
  ifstream file_1;
  shared_ptr<helics::HelicsConfigJSON> dptr;
  istringstream jstring;
  ifstream file;
  ConfigType type;
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> app;
  string namestring;
  string corestring;
  App *in_stack_fffffffffffff7d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7e0;
  undefined4 in_stack_fffffffffffff7e8;
  pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  undefined4 in_stack_fffffffffffff820;
  undefined4 in_stack_fffffffffffff824;
  undefined4 in_stack_fffffffffffff828;
  undefined4 in_stack_fffffffffffff82c;
  istringstream local_7c8 [128];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8b8;
  helicsCLI11App *in_stack_fffffffffffff8c0;
  string_view in_stack_fffffffffffff8e0;
  __shared_ptr local_638 [16];
  undefined1 local_628 [504];
  string *in_stack_fffffffffffffbd0;
  string *in_stack_fffffffffffffbd8;
  __shared_ptr local_410 [16];
  istringstream local_400 [384];
  undefined1 local_280 [520];
  __sv_type local_78;
  ConfigType local_68;
  string *local_10;
  
  this_00 = in_RDI;
  local_10 = in_RSI;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  anon_unknown_5::makeCLITypeApp(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  local_78 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffff7e0);
  configString._M_len._4_4_ = in_stack_fffffffffffff824;
  configString._M_len._0_4_ = in_stack_fffffffffffff820;
  configString._M_str._0_4_ = in_stack_fffffffffffff828;
  configString._M_str._4_4_ = in_stack_fffffffffffff82c;
  CVar2 = fileops::getConfigType(configString);
  this = (App *)(ulong)CVar2;
  local_68 = CVar2;
  switch(this) {
  case (App *)0x0:
    std::__cxx11::istringstream::istringstream(local_400,local_10,_S_in);
    CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
    operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
               0x5969a6);
    CLI::App::parse_from_stream(this,(istream *)in_stack_fffffffffffff7d8);
    std::__cxx11::istringstream::~istringstream(local_400);
    break;
  case (App *)0x1:
    std::ifstream::ifstream(local_280,local_10,_S_in);
    CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
    operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
               0x59691a);
    CLI::App::parse_from_stream(this,(istream *)in_stack_fffffffffffff7d8);
    std::ifstream::~ifstream(local_280);
    break;
  case (App *)0x2:
    phVar3 = CLI::std::
             unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
             operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                         *)0x596b2e);
    CLI::App::allow_extras(&phVar3->super_App,true);
    CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
    operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
               0x596b4a);
    CLI::App::get_config_formatter_base(in_stack_fffffffffffff7d8);
    std::static_pointer_cast<helics::HelicsConfigJSON,CLI::ConfigBase>
              ((shared_ptr<CLI::ConfigBase> *)CONCAT44(CVar2,in_stack_fffffffffffff7e8));
    CLI::std::shared_ptr<CLI::ConfigBase>::~shared_ptr((shared_ptr<CLI::ConfigBase> *)0x596b7e);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_638);
    if (bVar1) {
      peVar4 = CLI::std::
               __shared_ptr_access<helics::HelicsConfigJSON,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<helics::HelicsConfigJSON,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x596b9e);
      HelicsConfigJSON::skipJson(peVar4,true);
    }
    std::__cxx11::istringstream::istringstream(local_7c8,local_10,_S_in);
    CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
    operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
               0x596beb);
    CLI::App::parse_from_stream(this,(istream *)in_stack_fffffffffffff7d8);
    std::__cxx11::istringstream::~istringstream(local_7c8);
    CLI::std::shared_ptr<helics::HelicsConfigJSON>::~shared_ptr
              ((shared_ptr<helics::HelicsConfigJSON> *)0x596c11);
    break;
  case (App *)0x3:
    phVar3 = CLI::std::
             unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
             operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                         *)0x5969fd);
    CLI::App::allow_extras(&phVar3->super_App,true);
    CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
    operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
               0x596a19);
    CLI::App::get_config_formatter_base(in_stack_fffffffffffff7d8);
    std::static_pointer_cast<helics::HelicsConfigJSON,CLI::ConfigBase>
              ((shared_ptr<CLI::ConfigBase> *)CONCAT44(CVar2,in_stack_fffffffffffff7e8));
    CLI::std::shared_ptr<CLI::ConfigBase>::~shared_ptr((shared_ptr<CLI::ConfigBase> *)0x596a4d);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_410);
    if (bVar1) {
      peVar4 = CLI::std::
               __shared_ptr_access<helics::HelicsConfigJSON,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<helics::HelicsConfigJSON,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x596a6d);
      HelicsConfigJSON::skipJson(peVar4,true);
    }
    std::ifstream::ifstream(local_628,local_10,_S_in);
    CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
    operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
               0x596abd);
    CLI::App::parse_from_stream(this,(istream *)in_stack_fffffffffffff7d8);
    std::ifstream::~ifstream(local_628);
    CLI::std::shared_ptr<helics::HelicsConfigJSON>::~shared_ptr
              ((shared_ptr<helics::HelicsConfigJSON> *)0x596ae9);
    break;
  case (App *)0x4:
    CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
    operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
               0x596cc8);
    helicsCLI11App::helics_parse<std::__cxx11::string_const&>
              (in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8);
    break;
  case (App *)0x5:
  }
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x596c8a);
  if (bVar1) {
    CLI::std::
    pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              ((pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,(CoreType *)in_stack_fffffffffffff7d8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x596caf);
  }
  else {
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    coreTypeFromString(in_stack_fffffffffffff8e0);
    CLI::std::
    pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              ((pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,(CoreType *)in_stack_fffffffffffff7d8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x596d1f);
  }
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  ~unique_ptr((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
              this_00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  return in_RDI;
}

Assistant:

std::pair<CoreType, std::string> extractCoreType(const std::string& configureString)
{
    std::string corestring;
    std::string namestring;
    auto app = makeCLITypeApp(corestring, namestring);
    auto type = fileops::getConfigType(configureString);
    try {
        switch (type) {
            case fileops::ConfigType::JSON_FILE: {
                std::ifstream file{configureString};
                app->parse_from_stream(file);
                break;
            }
            case fileops::ConfigType::JSON_STRING: {
                std::istringstream jstring{configureString};
                app->parse_from_stream(jstring);
                break;
            }
            case fileops::ConfigType::TOML_FILE: {
                app->allow_extras();
                auto dptr =
                    std::static_pointer_cast<HelicsConfigJSON>(app->get_config_formatter_base());
                if (dptr) {
                    dptr->skipJson(true);
                }
                std::ifstream file{configureString};
                app->parse_from_stream(file);
                break;
            }
            case fileops::ConfigType::TOML_STRING: {
                app->allow_extras();
                auto dptr =
                    std::static_pointer_cast<HelicsConfigJSON>(app->get_config_formatter_base());
                if (dptr) {
                    dptr->skipJson(true);
                }
                std::istringstream tstring{configureString};
                app->parse_from_stream(tstring);
                break;
            }
            case fileops::ConfigType::CMD_LINE:
                app->helics_parse(configureString);
                break;
            case fileops::ConfigType::NONE:
                break;
        }
    }
    catch (const std::exception&) {
        corestring.clear();
    }
    if (corestring.empty()) {
        return {CoreType::DEFAULT, namestring};
    }
    return {coreTypeFromString(corestring), namestring};
}